

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O1

void duckdb::BitwiseNOTOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  ValidityMask *pVVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  data_ptr_t pdVar8;
  reference vector;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t iVar11;
  idx_t extraout_RDX_02;
  idx_t len;
  idx_t extraout_RDX_03;
  idx_t extraout_RDX_04;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  idx_t idx_in_entry;
  unsigned_long uVar15;
  ulong uVar16;
  data_ptr_t pdVar17;
  string_t target_4;
  string_t target;
  anon_union_16_2_67f50693_for_value local_d8;
  idx_t local_c0;
  Vector *local_b8;
  data_ptr_t local_b0;
  data_ptr_t local_a8;
  anon_union_16_2_67f50693_for_value local_a0;
  ulong local_90;
  anon_union_16_2_67f50693_for_value local_88;
  long local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  reference local_40;
  ulong local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  local_c0 = args->count;
  local_b8 = result;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_a8 = result->data;
    local_b0 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar3 == (unsigned_long *)0x0) {
      if (local_c0 != 0) {
        lVar14 = 8;
        iVar11 = extraout_RDX;
        do {
          local_d8.pointer.ptr = (char *)*(undefined8 *)(local_b0 + lVar14);
          local_d8._0_8_ = *(ulong *)(local_b0 + lVar14 + -8);
          local_88.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString
                         ((StringVector *)result,
                          (Vector *)(*(ulong *)(local_b0 + lVar14 + -8) & 0xffffffff),iVar11);
          Bit::BitwiseNot((bitstring_t *)&local_d8.pointer,(bitstring_t *)&local_88.pointer);
          *(undefined8 *)(local_a8 + lVar14 + -8) = local_88._0_8_;
          *(char **)(local_a8 + lVar14 + -8 + 8) = local_88.pointer.ptr;
          lVar14 = lVar14 + 0x10;
          local_c0 = local_c0 - 1;
          iVar11 = extraout_RDX_03;
        } while (local_c0 != 0);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar3;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < local_c0 + 0x3f) {
        local_90 = local_c0 + 0x3f >> 6;
        iVar11 = 0;
        uVar16 = 0;
        local_40 = vector;
        do {
          pdVar8 = local_a8;
          pdVar17 = local_b0;
          puVar3 = (local_40->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = puVar3[iVar11];
          }
          uVar9 = uVar16 + 0x40;
          if (local_c0 <= uVar16 + 0x40) {
            uVar9 = local_c0;
          }
          uVar13 = uVar9;
          local_38 = iVar11;
          if (uVar15 != 0) {
            uVar13 = uVar16;
            if (uVar15 == 0xffffffffffffffff) {
              if (uVar16 < uVar9) {
                uVar12 = uVar16 << 4 | 8;
                do {
                  local_d8.pointer.ptr = (char *)*(undefined8 *)(pdVar17 + uVar12);
                  local_d8._0_8_ = *(ulong *)(pdVar17 + (uVar12 - 8));
                  local_88.pointer =
                       (anon_struct_16_3_d7536bce_for_pointer)
                       StringVector::EmptyString
                                 ((StringVector *)result,
                                  (Vector *)(*(ulong *)(pdVar17 + (uVar12 - 8)) & 0xffffffff),iVar11
                                 );
                  Bit::BitwiseNot((bitstring_t *)&local_d8.pointer,(bitstring_t *)&local_88.pointer)
                  ;
                  *(undefined8 *)(pdVar8 + (uVar12 - 8)) = local_88._0_8_;
                  *(char **)(pdVar8 + (uVar12 - 8) + 8) = local_88.pointer.ptr;
                  uVar16 = uVar16 + 1;
                  uVar12 = uVar12 + 0x10;
                  iVar11 = extraout_RDX_00;
                  uVar13 = uVar16;
                } while (uVar9 != uVar16);
              }
            }
            else {
              result = local_b8;
              if (uVar16 < uVar9) {
                uVar12 = uVar16 << 4 | 8;
                uVar13 = 0;
                do {
                  if ((uVar15 >> (uVar13 & 0x3f) & 1) != 0) {
                    local_d8.pointer.ptr = (char *)*(undefined8 *)(pdVar17 + uVar12);
                    local_d8._0_8_ = *(ulong *)(pdVar17 + (uVar12 - 8));
                    local_88.pointer =
                         (anon_struct_16_3_d7536bce_for_pointer)
                         StringVector::EmptyString
                                   ((StringVector *)local_b8,
                                    (Vector *)(*(ulong *)(pdVar17 + (uVar12 - 8)) & 0xffffffff),
                                    iVar11);
                    Bit::BitwiseNot((bitstring_t *)&local_d8.pointer,
                                    (bitstring_t *)&local_88.pointer);
                    *(undefined8 *)(local_a8 + (uVar12 - 8)) = local_88._0_8_;
                    *(char **)(local_a8 + (uVar12 - 8) + 8) = local_88.pointer.ptr;
                    iVar11 = extraout_RDX_01;
                  }
                  uVar13 = uVar13 + 1;
                  uVar12 = uVar12 + 0x10;
                } while ((uVar16 - uVar9) + uVar13 != 0);
                uVar13 = uVar16 + uVar13;
                result = local_b8;
              }
            }
          }
          iVar11 = local_38 + 1;
          uVar16 = uVar13;
        } while (iVar11 != local_90);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar17 = result->data;
    paVar2 = (anon_union_16_2_67f50693_for_value *)vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_d8 = *paVar2;
    local_88.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::EmptyString
                   ((StringVector *)result,(Vector *)(*(ulong *)paVar2 & 0xffffffff),len);
    Bit::BitwiseNot((bitstring_t *)&local_d8.pointer,(bitstring_t *)&local_88.pointer);
    *(undefined8 *)pdVar17 = local_88._0_8_;
    *(char **)(pdVar17 + 8) = local_88.pointer.ptr;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_88.pointer);
    Vector::ToUnifiedFormat(vector,local_c0,(UnifiedVectorFormat *)&local_88.pointer);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar17 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78 == 0) {
      if (local_c0 != 0) {
        lVar14 = *(long *)local_88._0_8_;
        pdVar17 = pdVar17 + 8;
        uVar16 = 0;
        iVar11 = extraout_RDX_02;
        do {
          uVar9 = uVar16;
          if (lVar14 != 0) {
            uVar9 = (ulong)*(uint *)(lVar14 + uVar16 * 4);
          }
          local_a0._0_8_ = *(undefined8 *)(local_88.pointer.ptr + uVar9 * 0x10);
          local_a0.pointer.ptr = (char *)*(undefined8 *)(local_88.pointer.ptr + uVar9 * 0x10 + 8);
          local_d8.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString
                         ((StringVector *)local_b8,(Vector *)(local_a0._0_8_ & 0xffffffff),iVar11);
          Bit::BitwiseNot((bitstring_t *)&local_a0.pointer,(bitstring_t *)&local_d8.pointer);
          *(undefined8 *)(pdVar17 + -8) = local_d8._0_8_;
          *(char **)pdVar17 = local_d8.pointer.ptr;
          uVar16 = uVar16 + 1;
          pdVar17 = pdVar17 + 0x10;
          iVar11 = extraout_RDX_04;
        } while (local_c0 != uVar16);
      }
    }
    else if (local_c0 != 0) {
      lVar14 = *(long *)local_88._0_8_;
      pVVar5 = &local_b8->validity;
      pdVar17 = pdVar17 + 8;
      uVar16 = 0;
      do {
        uVar9 = uVar16;
        if (lVar14 != 0) {
          uVar9 = (ulong)*(uint *)(lVar14 + uVar16 * 4);
        }
        if ((*(ulong *)(local_78 + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) & 1) == 0) {
          if ((local_b8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_a0._0_8_ =
                 (local_b8->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_d8.pointer,(unsigned_long *)&local_a0);
            uVar6 = local_d8._0_8_;
            uVar7 = local_d8.pointer.ptr;
            local_d8 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
            this = (local_b8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (local_b8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar6;
            (local_b8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.pointer.ptr !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8.pointer.ptr);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data
                                );
            (local_b8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar4 = (byte)uVar16 & 0x3f;
          puVar1 = (local_b8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar16 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        }
        else {
          local_a0._0_8_ = *(undefined8 *)(local_88.pointer.ptr + uVar9 * 0x10);
          local_a0.pointer.ptr = (char *)*(undefined8 *)(local_88.pointer.ptr + uVar9 * 0x10 + 8);
          local_d8.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString
                         ((StringVector *)local_b8,(Vector *)(local_a0._0_8_ & 0xffffffff),
                          uVar9 >> 6);
          Bit::BitwiseNot((bitstring_t *)&local_a0.pointer,(bitstring_t *)&local_d8.pointer);
          *(undefined8 *)(pdVar17 + -8) = local_d8._0_8_;
          *(char **)pdVar17 = local_d8.pointer.ptr;
        }
        uVar16 = uVar16 + 1;
        pdVar17 = pdVar17 + 0x10;
      } while (local_c0 != uVar16);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
  }
  return;
}

Assistant:

static void BitwiseNOTOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	UnaryExecutor::Execute<string_t, string_t>(args.data[0], result, args.size(), [&](string_t input) {
		string_t target = StringVector::EmptyString(result, input.GetSize());

		Bit::BitwiseNot(input, target);
		return target;
	});
}